

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

bool P_LookForPlayers(AActor *actor,INTBOOL allaround,FLookExParams *params)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  TObjPtr<AActor> *pTVar4;
  AActor *pAVar5;
  int iVar6;
  double dVar7;
  bool local_81;
  byte local_71;
  undefined1 local_70 [20];
  TFlags<ActorFlag3,_unsigned_int> local_5c;
  TFlags<ActorFlag,_unsigned_int> local_58;
  TFlags<ActorFlag6,_unsigned_int> local_54;
  TFlags<ActorFlag,_unsigned_int> local_50;
  TFlags<ActorFlag,_unsigned_int> local_4c;
  byte local_45;
  TFlags<ActorFlag,_unsigned_int> local_44;
  bool result;
  byte local_39;
  undefined8 *puStack_38;
  bool chasegoal;
  player_t *player;
  int pnum;
  int c;
  FLookExParams *params_local;
  AActor *pAStack_18;
  INTBOOL allaround_local;
  AActor *actor_local;
  
  if (params == (FLookExParams *)0x0) {
    local_71 = 1;
  }
  else {
    local_71 = (params->flags & 4U) != 0 ^ 0xff;
  }
  local_39 = local_71 & 1;
  _pnum = params;
  params_local._4_4_ = allaround;
  pAStack_18 = actor;
  if (actor->TIDtoHate == 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_44,
               (int)actor +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
    if (uVar2 != 0) {
      local_45 = P_LookForEnemies(pAStack_18,params_local._4_4_,_pnum);
      if ((pAStack_18->FriendPlayer == '\0') &&
         ((bVar1 = FBoolCVar::operator_cast_to_bool(&teamplay), !bVar1 ||
          (iVar6 = AActor::GetTeam(pAStack_18), iVar6 == 0xff)))) {
        return (bool)(local_45 & 1);
      }
      if (((local_45 & 1) != 0) || (iVar6 = FIntCVar::operator_cast_to_int(&deathmatch), iVar6 == 0)
         ) {
        return true;
      }
    }
  }
  else {
    bVar1 = P_LookForTID(actor,allaround,params);
    if (bVar1) {
      return true;
    }
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)&stack0xffffffffffffffc0,
               (int)pAStack_18 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&stack0xffffffffffffffc0);
    if (uVar2 == 0) {
      return false;
    }
  }
  if (((((gameinfo.gametype & GAME_DoomStrifeChex) == GAME_Any) && ((multiplayer & 1U) == 0)) &&
      (DAT_01ae7158 < 1)) &&
     ((bVar1 = TObjPtr<AActor>::operator==(&pAStack_18->goal,(AActor *)0x0), bVar1 &&
      (gamestate != GS_TITLELEVEL)))) {
    actor_local._7_1_ = P_LookForMonsters(pAStack_18);
  }
  else {
    player._4_4_ = 0;
    if (pAStack_18->TIDtoHate == 0) {
      player._0_4_ = (uint)pAStack_18->LastLookPlayerNumber;
    }
    else {
      uVar2 = FRandom::operator()(&pr_look2);
      player._0_4_ = uVar2 & 7;
    }
    do {
      do {
        do {
          do {
            iVar6 = player._4_4_ + 1;
            if (7 < player._4_4_) {
              player._4_4_ = iVar6;
              bVar1 = TObjPtr<AActor>::operator==(&pAStack_18->target,(AActor *)0x0);
              if (bVar1) {
                bVar1 = TObjPtr<AActor>::operator!=(&pAStack_18->goal,(AActor *)0x0);
                if ((bVar1) && ((local_39 & 1) != 0)) {
                  (pAStack_18->target).field_0 = (pAStack_18->goal).field_0;
                  return true;
                }
                bVar1 = TObjPtr<AActor>::operator!=(&pAStack_18->lastenemy,(AActor *)0x0);
                if ((bVar1) &&
                   (pAVar3 = TObjPtr<AActor>::operator->(&pAStack_18->lastenemy),
                   pAVar5 = pAStack_18, 0 < pAVar3->health)) {
                  pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pAStack_18->lastenemy);
                  bVar1 = AActor::IsFriend(pAVar5,pAVar3);
                  if (!bVar1) {
                    (pAStack_18->target).field_0 = (pAStack_18->lastenemy).field_0;
                    TObjPtr<AActor>::operator=(&pAStack_18->lastenemy,(AActor *)0x0);
                    return true;
                  }
                  TObjPtr<AActor>::operator=(&pAStack_18->lastenemy,(AActor *)0x0);
                }
              }
              pTVar4 = &pAStack_18->target;
              pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pAStack_18->goal);
              bVar1 = TObjPtr<AActor>::operator==(pTVar4,pAVar5);
              local_81 = false;
              if (bVar1) {
                local_81 = TObjPtr<AActor>::operator!=(&pAStack_18->goal,(AActor *)0x0);
              }
              return local_81;
            }
            player._0_4_ = (uint)player + 1 & 7;
            player._4_4_ = iVar6;
          } while ((playeringame[(int)(uint)player] & 1U) == 0);
          if (pAStack_18->TIDtoHate == 0) {
            pAStack_18->LastLookPlayerNumber = (SBYTE)(uint)player;
          }
          puStack_38 = &players + (long)(int)(uint)player * 0x54;
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_4c,
                     (int)*puStack_38 +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
        } while ((((uVar2 == 0) || ((*(uint *)(puStack_38 + 0x1d) & 8) != 0)) ||
                 (*(int *)(puStack_38 + 0x13) < 1)) ||
                (bVar1 = P_IsVisible(pAStack_18,(AActor *)*puStack_38,params_local._4_4_,_pnum),
                !bVar1));
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_50,
                   (int)pAStack_18 +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
      } while ((uVar2 != 0) && (bVar1 = AActor::IsFriend(pAStack_18,(AActor *)*puStack_38), bVar1));
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_54,
                 (int)pAStack_18 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
      if (uVar2 != 0) break;
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_58,
                 (int)*puStack_38 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_58);
      if ((uVar2 == 0) || (bVar1 = true, (i_compatflags & 0x10000U) != 0)) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_5c,
                   (int)*puStack_38 +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
        bVar1 = uVar2 != 0;
      }
      if (!bVar1) break;
      dVar7 = AActor::Distance2D((AActor *)*puStack_38,pAStack_18,false);
      bVar1 = false;
      if (128.0 < dVar7) {
        TVector3<double>::XY((TVector3<double> *)local_70);
        dVar7 = TVector2<double>::LengthSquared((TVector2<double> *)local_70);
        bVar1 = dVar7 < 25.0;
      }
    } while ((bVar1) || (iVar6 = FRandom::operator()(&pr_lookforplayers), iVar6 < 0xe1));
    pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pAStack_18->goal);
    if (pAVar5 != (AActor *)0x0) {
      pTVar4 = &pAStack_18->target;
      pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pAStack_18->goal);
      bVar1 = TObjPtr<AActor>::operator==(pTVar4,pAVar5);
      if (bVar1) {
        pAStack_18->reactiontime = 0;
      }
    }
    TObjPtr<AActor>::operator=(&pAStack_18->target,(AActor *)*puStack_38);
    actor_local._7_1_ = true;
  }
  return actor_local._7_1_;
}

Assistant:

bool P_LookForPlayers (AActor *actor, INTBOOL allaround, FLookExParams *params)
{
	int 		c;
	int			pnum;
	player_t*	player;
	bool chasegoal = params? (!(params->flags & LOF_DONTCHASEGOAL)) : true;

	if (actor->TIDtoHate != 0)
	{
		if (P_LookForTID (actor, allaround, params))
		{
			return true;
		}
		if (!(actor->flags3 & MF3_HUNTPLAYERS))
		{
			return false;
		}
	}
	else if (actor->flags & MF_FRIENDLY)
	{
		bool result = P_LookForEnemies (actor, allaround, params);

#ifdef MBF_FRIENDS
		if (!result && (actor->flags & MF_FRIEND_MBF))
		{  // killough 9/9/98: friendly monsters go about players differently

			// Go back to a player, no matter whether it's visible or not
			for (int anyone=0; anyone<=1; anyone++)
			{
				for (int c=0; c<MAXPLAYERS; c++)
				{
					if (playeringame[c] && players[c].playerstate==PST_LIVE &&
						actor->IsFriend(players[c].mo) &&
						(anyone || P_IsVisible(actor, players[c].mo, allaround)))
					{
						actor->target = players[c].mo;

						// killough 12/98:
						// get out of refiring loop, to avoid hitting player accidentally

						if (actor->MissileState != NULL)
						{
							actor->SetState(actor->SeeState, true);
							actor->flags &= ~MF_JUSTHIT;
						}

						return true;
					}
				}
			}
		}
#endif
		// [SP] If you don't see any enemies in deathmatch, look for players (but only when friend to a specific player.)
		if (actor->FriendPlayer == 0 && (!teamplay || actor->GetTeam() == TEAM_NONE)) return result;
		if (result || !deathmatch) return true;


	}	// [SP] if false, and in deathmatch, intentional fall-through

	if (!(gameinfo.gametype & (GAME_DoomStrifeChex)) &&
		!multiplayer &&
		players[0].health <= 0 && 
		actor->goal == NULL &&
		gamestate != GS_TITLELEVEL
		)
	{ // Single player game and player is dead; look for monsters
		return P_LookForMonsters (actor);
	}

	c = 0;
	if (actor->TIDtoHate != 0)
	{
		pnum = pr_look2() & (MAXPLAYERS-1);
	}
	else
	{
		pnum = actor->LastLookPlayerNumber;
	}
		
	for (;;)
	{
		// [ED850] Each and every player should only ever be checked once.
		if (c++ < MAXPLAYERS)
		{
			pnum = (pnum + 1) & (MAXPLAYERS - 1);
			if (!playeringame[pnum])
				continue;

			if (actor->TIDtoHate == 0)
			{
				actor->LastLookPlayerNumber = pnum;
			}
		}
		else
		{
			// done looking
			if (actor->target == NULL)
			{
				// [RH] use goal as target
				// [KS] ...unless we're ignoring goals and we don't already have one
				if (actor->goal != NULL && chasegoal)
				{
					actor->target = actor->goal;
					return true;
				}
				// Use last known enemy if no players sighted -- killough 2/15/98:
				if (actor->lastenemy != NULL && actor->lastenemy->health > 0)
				{
					if (!actor->IsFriend(actor->lastenemy))
					{
						actor->target = actor->lastenemy;
						actor->lastenemy = NULL;
						return true;
					}
					else
					{
						actor->lastenemy = NULL;
					}
				}
			}
			return actor->target == actor->goal && actor->goal != NULL;
		}

		player = &players[pnum];

		if (!(player->mo->flags & MF_SHOOTABLE))
			continue;			// not shootable (observer or dead)

		if (player->cheats & CF_NOTARGET)
			continue;			// no target

		if (player->health <= 0)
			continue;			// dead

		if (!P_IsVisible (actor, player->mo, allaround, params))
			continue;			// out of sight

		// [SP] Deathmatch fixes - if we have MF_FRIENDLY we're definitely in deathmatch
		// We're going to ignore our master, but go after his enemies.
		if ( actor->flags & MF_FRIENDLY )
		{
			if ( actor->IsFriend(player->mo) )
				continue;
		}

		// [RC] Well, let's let special monsters with this flag active be able to see
		// the player then, eh?
		if(!(actor->flags6 & MF6_SEEINVISIBLE)) 
		{
			if ((player->mo->flags & MF_SHADOW && !(i_compatflags & COMPATF_INVISIBILITY)) ||
				player->mo->flags3 & MF3_GHOST)
			{
				if (player->mo->Distance2D (actor) > 128 && player->mo->Vel.XY().LengthSquared() < 5*5)
				{ // Player is sneaking - can't detect
					continue;
				}
				if (pr_lookforplayers() < 225)
				{ // Player isn't sneaking, but still didn't detect
					continue;
				}
			}
		}
		
		// [RH] Need to be sure the reactiontime is 0 if the monster is
		//		leaving its goal to go after a player.
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = player->mo;
		return true;
	}
}